

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toctree.c
# Opt level: O0

char * blogc_toctree_render(bc_slist_t *headers,int maxdepth,char *endl)

{
  ulong *puVar1;
  bc_string_t *str;
  char *local_e8;
  char *local_d0;
  char *local_c0;
  char *local_a8;
  char *local_90;
  char *local_78;
  blogc_toctree_header_t *t;
  bc_slist_t *l_1;
  size_t current_level;
  size_t spacing;
  bc_string_t *rv;
  size_t lv;
  bc_slist_t *l;
  size_t lower_level;
  char *endl_local;
  int maxdepth_local;
  bc_slist_t *headers_local;
  
  if ((headers == (bc_slist_t *)0x0) || (maxdepth == 0)) {
    headers_local = (bc_slist_t *)0x0;
  }
  else {
    l = (bc_slist_t *)0x0;
    for (lv = (size_t)headers; lv != 0; lv = *(size_t *)lv) {
      if ((l == (bc_slist_t *)0x0) || ((bc_slist_t *)**(ulong **)(lv + 8) < l)) {
        l = (bc_slist_t *)**(ulong **)(lv + 8);
      }
    }
    if (l == (bc_slist_t *)0x0) {
      headers_local = (bc_slist_t *)0x0;
    }
    else {
      str = bc_string_new();
      local_78 = endl;
      if (endl == (char *)0x0) {
        local_78 = "\n";
      }
      bc_string_append_printf(str,"<ul>%s",local_78);
      current_level = 4;
      l_1 = l;
      for (t = (blogc_toctree_header_t *)headers; t != (blogc_toctree_header_t *)0x0;
          t = (blogc_toctree_header_t *)t->level) {
        puVar1 = (ulong *)t->slug;
        if (*puVar1 - (long)l < (ulong)(long)maxdepth) {
          for (; (bc_slist_t *)*puVar1 < l_1; l_1 = (bc_slist_t *)((long)&l_1[-1].data + 7)) {
            current_level = current_level - 4;
            local_90 = endl;
            if (endl == (char *)0x0) {
              local_90 = "\n";
            }
            bc_string_append_printf(str,"%*s</ul>%s",current_level,"",local_90);
          }
          for (; l_1 < (bc_slist_t *)*puVar1; l_1 = (bc_slist_t *)((long)&l_1->next + 1)) {
            local_a8 = endl;
            if (endl == (char *)0x0) {
              local_a8 = "\n";
            }
            bc_string_append_printf(str,"%*s<ul>%s",current_level,"",local_a8);
            current_level = current_level + 4;
          }
          bc_string_append_printf(str,"%*s<li>",current_level,"");
          if (puVar1[1] == 0) {
            bc_string_append(str,(char *)puVar1[2]);
          }
          else {
            if (puVar1[2] == 0) {
              local_c0 = "";
            }
            else {
              local_c0 = (char *)puVar1[2];
            }
            bc_string_append_printf(str,"<a href=\"#%s\">%s</a>",puVar1[1],local_c0);
          }
          local_d0 = endl;
          if (endl == (char *)0x0) {
            local_d0 = "\n";
          }
          bc_string_append_printf(str,"</li>%s",local_d0);
        }
      }
      for (; l <= l_1; l_1 = (bc_slist_t *)((long)&l_1[-1].data + 7)) {
        current_level = current_level - 4;
        local_e8 = endl;
        if (endl == (char *)0x0) {
          local_e8 = "\n";
        }
        bc_string_append_printf(str,"%*s</ul>%s",current_level,"",local_e8);
      }
      headers_local = (bc_slist_t *)bc_string_free(str,false);
    }
  }
  return (char *)headers_local;
}

Assistant:

char*
blogc_toctree_render(bc_slist_t *headers, int maxdepth, const char *endl)
{
    if (headers == NULL || maxdepth == 0)
        return NULL;

    // find lower level
    size_t lower_level = 0;
    for (bc_slist_t *l = headers; l != NULL; l = l->next) {
        size_t lv = ((blogc_toctree_header_t*) l->data)->level;
        if (lower_level == 0 || lower_level > lv) {
            lower_level = lv;
        }
    }

    if (lower_level == 0)
        return NULL;

    // render
    bc_string_t *rv = bc_string_new();
    bc_string_append_printf(rv, "<ul>%s", endl == NULL ? "\n" : endl);
    size_t spacing = 4;
    size_t current_level = lower_level;
    for (bc_slist_t *l = headers; l != NULL; l = l->next) {
        blogc_toctree_header_t *t = l->data;
        if (t->level - lower_level >= maxdepth) {
            continue;
        }
        while (current_level > t->level) {
            spacing -= 4;
            bc_string_append_printf(rv, "%*s</ul>%s", spacing, "",
                endl == NULL ? "\n" : endl);
            current_level--;
        }
        while (current_level < t->level) {
            bc_string_append_printf(rv, "%*s<ul>%s", spacing, "",
                endl == NULL ? "\n" : endl);
            current_level++;
            spacing += 4;
        }
        bc_string_append_printf(rv, "%*s<li>", spacing, "");
        if (t->slug != NULL) {
            bc_string_append_printf(rv, "<a href=\"#%s\">%s</a>", t->slug,
                t->text != NULL ? t->text : "");
        }
        else {
            bc_string_append(rv, t->text);
        }
        bc_string_append_printf(rv, "</li>%s", endl == NULL ? "\n" : endl);
    }

    // close leftovers
    while (current_level >= lower_level) {
        spacing -= 4;
        bc_string_append_printf(rv, "%*s</ul>%s", spacing, "",
            endl == NULL ? "\n" : endl);
        current_level--;
    }

    return bc_string_free(rv, false);
}